

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VInvTest_Serial(N_Vector x,N_Vector z)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int no_zero_found;
  sunrealtype *zd;
  sunrealtype *xd;
  sunindextype N;
  sunindextype i;
  N_Vector z_local;
  N_Vector x_local;
  
  lVar2 = *x->content;
  lVar3 = *(long *)((long)x->content + 0x10);
  lVar4 = *(long *)((long)z->content + 0x10);
  no_zero_found = 1;
  for (i = 0; i < lVar2; i = i + 1) {
    dVar1 = *(double *)(lVar3 + i * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      *(double *)(lVar4 + i * 8) = 1.0 / *(double *)(lVar3 + i * 8);
    }
    else {
      no_zero_found = 0;
    }
  }
  return no_zero_found;
}

Assistant:

sunbooleantype N_VInvTest_Serial(N_Vector x, N_Vector z)
{
  sunindextype i, N;
  sunrealtype *xd, *zd;
  sunbooleantype no_zero_found;

  xd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  zd = NV_DATA_S(z);

  no_zero_found = SUNTRUE;
  for (i = 0; i < N; i++)
  {
    if (xd[i] == ZERO) { no_zero_found = SUNFALSE; }
    else { zd[i] = ONE / xd[i]; }
  }

  return no_zero_found;
}